

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

void __thiscall ki::dml::Record::add_field(Record *this,FieldBase *field)

{
  undefined1 local_60 [72];
  FieldBase *local_18;
  FieldBase *field_local;
  Record *this_local;
  
  local_18 = field;
  field_local = (FieldBase *)this;
  std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::push_back
            (&this->m_fields,&local_18);
  FieldBase::get_name_abi_cxx11_((FieldBase *)local_60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>
              *)(local_60 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,&local_18
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::insert(&this->m_field_map,(value_type *)(local_60 + 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>
           *)(local_60 + 0x20));
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void Record::add_field(FieldBase* field)
	{
		m_fields.push_back(field);
		m_field_map.insert({ field->get_name(), field });
	}